

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horizontal.cpp
# Opt level: O0

void __thiscall
cppurses::layout::Horizontal::collect_space
          (Horizontal *this,
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          *widgets,int width_left)

{
  value_type vVar1;
  ulong uVar2;
  bool bVar3;
  Type TVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  reference pDVar8;
  reference pvVar9;
  double dVar10;
  undefined4 uVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Type policy_7;
  Dimensions_reference *d_7;
  iterator __end2_7;
  iterator __begin2_7;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_7;
  Dimensions_reference *local_220;
  __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
  local_218;
  __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
  local_210;
  const_iterator local_208;
  ulong local_200;
  Type local_1f4;
  reference pDStack_1f0;
  Type policy_6;
  Dimensions_reference *d_6;
  iterator __end2_6;
  iterator __begin2_6;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_6;
  Type policy_5;
  Dimensions_reference *d_5;
  iterator __end2_5;
  iterator __begin2_5;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_5;
  Type policy_4;
  Dimensions_reference *d_4;
  iterator __end2_4;
  iterator __begin2_4;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_4;
  Type policy_3;
  Dimensions_reference *d_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_3;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_150;
  Dimensions_reference *local_138;
  __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
  local_130;
  __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
  local_128;
  const_iterator local_120;
  ulong local_118 [3];
  Type local_fc;
  reference pDStack_f8;
  Type policy_2;
  Dimensions_reference *d_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_2;
  int to_collect;
  int index;
  deque<unsigned_long,_std::allocator<unsigned_long>_> width_deductions;
  Type policy_1;
  Dimensions_reference *d_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_1;
  double total_inverse;
  Type policy;
  Dimensions_reference *d;
  iterator __end2;
  iterator __begin2;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2;
  size_t total_stretch;
  int width_left_local;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *widgets_local;
  Horizontal *this_local;
  
  if (width_left != 0) {
    __range2 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                *)0x0;
    __end2 = std::
             vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             ::begin(widgets);
    d = (Dimensions_reference *)
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::end(widgets);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                                       *)&d), bVar3) {
      pDVar8 = __gnu_cxx::
               __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
               ::operator*(&__end2);
      TVar4 = Size_policy::type(&pDVar8->widget->width_policy);
      if (((TVar4 == Maximum) || (TVar4 == Preferred)) || (TVar4 == Ignored)) {
        sVar5 = Size_policy::stretch(&pDVar8->widget->width_policy);
        __range2 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    *)((long)&(__range2->
                              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                              )._M_impl.super__Vector_impl_data._M_start + sVar5);
      }
      __gnu_cxx::
      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
      ::operator++(&__end2);
    }
    __range2_1 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  *)0x0;
    __end2_1 = std::
               vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               ::begin(widgets);
    d_1 = (Dimensions_reference *)
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::end(widgets);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                          *)&d_1);
      uVar15 = (undefined4)((ulong)__range2 >> 0x20);
      if (!bVar3) break;
      pDVar8 = __gnu_cxx::
               __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
               ::operator*(&__end2_1);
      width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node._4_4_ =
           Size_policy::type(&pDVar8->widget->width_policy);
      if (((width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ == Maximum) ||
          (width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Deque_impl_data._M_finish._M_node._4_4_ == Preferred)) ||
         (width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_finish._M_node._4_4_ == Ignored)) {
        sVar5 = Size_policy::stretch(&pDVar8->widget->width_policy);
        auVar16._8_4_ = (int)(sVar5 >> 0x20);
        auVar16._0_8_ = sVar5;
        auVar16._12_4_ = 0x45300000;
        auVar11._8_4_ = uVar15;
        auVar11._0_8_ = __range2;
        auVar11._12_4_ = 0x45300000;
        __range2_1 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      *)(1.0 / (((auVar16._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                               ((auVar11._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)__range2) - 4503599627370496.0))) +
                        (double)__range2_1);
      }
      __gnu_cxx::
      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
      ::operator++(&__end2_1);
    }
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
    __range2_2._4_4_ = 0;
    __end2_2 = std::
               vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               ::begin(widgets);
    d_2 = (Dimensions_reference *)
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::end(widgets);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                               *)&d_2), bVar3) {
      pDStack_f8 = __gnu_cxx::
                   __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                   ::operator*(&__end2_2);
      local_fc = Size_policy::type(&pDStack_f8->widget->width_policy);
      if (((local_fc == Maximum) || (local_fc == Preferred)) || (local_fc == Ignored)) {
        sVar5 = Size_policy::stretch(&pDStack_f8->widget->width_policy);
        auVar17._8_4_ = (int)(sVar5 >> 0x20);
        auVar17._0_8_ = sVar5;
        auVar17._12_4_ = 0x45300000;
        auVar12._8_4_ = uVar15;
        auVar12._0_8_ = __range2;
        auVar12._12_4_ = 0x45300000;
        dVar10 = ((1.0 / (((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                         ((auVar12._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)__range2) - 4503599627370496.0)))) /
                 (double)__range2_1) * (double)-width_left;
        local_118[0] = (ulong)dVar10;
        local_118[0] = local_118[0] |
                       (long)(dVar10 - 9.223372036854776e+18) & (long)local_118[0] >> 0x3f;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect,local_118);
        sVar5 = *pDStack_f8->width;
        pvVar9 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::back
                           ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
        vVar1 = *pvVar9;
        sVar6 = Size_policy::min_size(&pDStack_f8->widget->width_policy);
        if (sVar5 - vVar1 < sVar6) {
          sVar5 = *pDStack_f8->width;
          sVar6 = Size_policy::min_size(&pDStack_f8->widget->width_policy);
          sVar7 = Size_policy::min_size(&pDStack_f8->widget->width_policy);
          *pDStack_f8->width = sVar7;
          local_130._M_current =
               (Dimensions_reference *)
               std::
               begin<std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
                         (widgets);
          local_128 = __gnu_cxx::
                      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                      ::operator+(&local_130,(long)__range2_2._4_4_);
          __gnu_cxx::
          __normal_iterator<cppurses::layout::Layout::Dimensions_reference_const*,std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
          ::__normal_iterator<cppurses::layout::Layout::Dimensions_reference*>
                    ((__normal_iterator<cppurses::layout::Layout::Dimensions_reference_const*,std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
                      *)&local_120,&local_128);
          local_138 = (Dimensions_reference *)
                      std::
                      vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      ::erase(widgets,local_120);
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::vector(&local_150,widgets);
          collect_space(this,&local_150,width_left + ((int)sVar5 - (int)sVar6));
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::~vector(&local_150);
          goto LAB_002143af;
        }
      }
      __range2_2._4_4_ = __range2_2._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
      ::operator++(&__end2_2);
    }
    __end2_3 = std::
               vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               ::begin(widgets);
    d_3 = (Dimensions_reference *)
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::end(widgets);
    total_stretch._4_4_ = width_left;
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                               *)&d_3), bVar3) {
      pDVar8 = __gnu_cxx::
               __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
               ::operator*(&__end2_3);
      TVar4 = Size_policy::type(&pDVar8->widget->width_policy);
      if (((TVar4 == Maximum) || (TVar4 == Preferred)) || (TVar4 == Ignored)) {
        uVar2 = *pDVar8->width;
        pvVar9 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                           ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
        if (uVar2 < *pvVar9) {
          *pDVar8->width = 0;
        }
        else {
          pvVar9 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                             ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
          *pDVar8->width = *pDVar8->width - *pvVar9;
        }
        pvVar9 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                           ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
        total_stretch._4_4_ = total_stretch._4_4_ + (int)*pvVar9;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                  ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
      }
      __gnu_cxx::
      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
      ::operator++(&__end2_3);
    }
    if (total_stretch._4_4_ != 0) {
      __range2 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  *)0x0;
      __end2_4 = std::
                 vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 ::begin(widgets);
      d_4 = (Dimensions_reference *)
            std::
            vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ::end(widgets);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_4,
                                (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                                 *)&d_4), bVar3) {
        pDVar8 = __gnu_cxx::
                 __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                 ::operator*(&__end2_4);
        TVar4 = Size_policy::type(&pDVar8->widget->width_policy);
        if (TVar4 == Expanding) {
          sVar5 = Size_policy::stretch(&pDVar8->widget->width_policy);
          __range2 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      *)((long)&(__range2->
                                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                )._M_impl.super__Vector_impl_data._M_start + sVar5);
        }
        __gnu_cxx::
        __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
        ::operator++(&__end2_4);
      }
      __range2_1 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    *)0x0;
      __end2_5 = std::
                 vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 ::begin(widgets);
      d_5 = (Dimensions_reference *)
            std::
            vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ::end(widgets);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end2_5,
                           (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                            *)&d_5);
        uVar15 = (undefined4)((ulong)__range2 >> 0x20);
        if (!bVar3) break;
        pDVar8 = __gnu_cxx::
                 __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                 ::operator*(&__end2_5);
        TVar4 = Size_policy::type(&pDVar8->widget->width_policy);
        if (TVar4 == Expanding) {
          sVar5 = Size_policy::stretch(&pDVar8->widget->width_policy);
          auVar18._8_4_ = (int)(sVar5 >> 0x20);
          auVar18._0_8_ = sVar5;
          auVar18._12_4_ = 0x45300000;
          auVar13._8_4_ = uVar15;
          auVar13._0_8_ = __range2;
          auVar13._12_4_ = 0x45300000;
          __range2_1 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                        *)(1.0 / (((auVar18._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                                 ((auVar13._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)__range2) - 4503599627370496.0)))
                          + (double)__range2_1);
        }
        __gnu_cxx::
        __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
        ::operator++(&__end2_5);
      }
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
      __range2_2._4_4_ = 0;
      __end2_6 = std::
                 vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 ::begin(widgets);
      d_6 = (Dimensions_reference *)
            std::
            vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ::end(widgets);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_6,
                                (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                                 *)&d_6), bVar3) {
        pDStack_1f0 = __gnu_cxx::
                      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                      ::operator*(&__end2_6);
        local_1f4 = Size_policy::type(&pDStack_1f0->widget->width_policy);
        if (local_1f4 == Expanding) {
          sVar5 = Size_policy::stretch(&pDStack_1f0->widget->width_policy);
          auVar19._8_4_ = (int)(sVar5 >> 0x20);
          auVar19._0_8_ = sVar5;
          auVar19._12_4_ = 0x45300000;
          auVar14._8_4_ = uVar15;
          auVar14._0_8_ = __range2;
          auVar14._12_4_ = 0x45300000;
          dVar10 = ((1.0 / (((auVar19._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                           ((auVar14._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)__range2) - 4503599627370496.0)))) /
                   (double)__range2_1) * (double)-total_stretch._4_4_;
          local_200 = (ulong)dVar10;
          local_200 = local_200 | (long)(dVar10 - 9.223372036854776e+18) & (long)local_200 >> 0x3f;
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect,&local_200)
          ;
          sVar5 = *pDStack_1f0->width;
          pvVar9 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::back
                             ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
          vVar1 = *pvVar9;
          sVar6 = Size_policy::min_size(&pDStack_1f0->widget->width_policy);
          if (sVar5 - vVar1 < sVar6) {
            sVar5 = *pDStack_1f0->width;
            sVar6 = Size_policy::min_size(&pDStack_1f0->widget->width_policy);
            sVar7 = Size_policy::min_size(&pDStack_1f0->widget->width_policy);
            *pDStack_1f0->width = sVar7;
            local_218._M_current =
                 (Dimensions_reference *)
                 std::
                 begin<std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
                           (widgets);
            local_210 = __gnu_cxx::
                        __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                        ::operator+(&local_218,(long)__range2_2._4_4_);
            __gnu_cxx::
            __normal_iterator<cppurses::layout::Layout::Dimensions_reference_const*,std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
            ::__normal_iterator<cppurses::layout::Layout::Dimensions_reference*>
                      ((__normal_iterator<cppurses::layout::Layout::Dimensions_reference_const*,std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
                        *)&local_208,&local_210);
            local_220 = (Dimensions_reference *)
                        std::
                        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                        ::erase(widgets,local_208);
            std::
            vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ::vector((vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      *)&__range2_7,widgets);
            collect_space(this,(vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                *)&__range2_7,total_stretch._4_4_ + ((int)sVar5 - (int)sVar6));
            std::
            vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ::~vector((vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                       *)&__range2_7);
            goto LAB_002143af;
          }
        }
        __range2_2._4_4_ = __range2_2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
        ::operator++(&__end2_6);
      }
      __end2_7 = std::
                 vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 ::begin(widgets);
      d_7 = (Dimensions_reference *)
            std::
            vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ::end(widgets);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_7,
                                (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                                 *)&d_7), bVar3) {
        pDVar8 = __gnu_cxx::
                 __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                 ::operator*(&__end2_7);
        TVar4 = Size_policy::type(&pDVar8->widget->width_policy);
        if (TVar4 == Expanding) {
          uVar2 = *pDVar8->width;
          pvVar9 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                             ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
          if (uVar2 < *pvVar9) {
            *pDVar8->width = 0;
          }
          else {
            pvVar9 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                               ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect)
            ;
            *pDVar8->width = *pDVar8->width - *pvVar9;
          }
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
        }
        __gnu_cxx::
        __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
        ::operator++(&__end2_7);
      }
    }
LAB_002143af:
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::~deque
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_collect);
  }
  return;
}

Assistant:

void Horizontal::collect_space(std::vector<Dimensions_reference> widgets,
                               int width_left) {
    if (width_left == 0) {
        return;
    }
    // Find total stretch of first group
    std::size_t total_stretch{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Find total of inverse of percentages
    double total_inverse{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            total_inverse += 1 / (d.widget->width_policy.stretch() /
                                  static_cast<double>(total_stretch));
        }
    }

    // Calculate new widths of widgets in new group, if any go under min_width
    // then assign min value and recurse without that widget in vector.
    std::deque<std::size_t> width_deductions;
    int index{0};
    auto to_collect = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            width_deductions.push_back(
                ((1 / (d.widget->width_policy.stretch() /
                       static_cast<double>(total_stretch))) /
                 static_cast<double>(total_inverse)) *
                (to_collect * -1));
            if ((*d.width - width_deductions.back()) <
                d.widget->width_policy.min_size()) {
                width_left += *d.width - d.widget->width_policy.min_size();
                *d.width = d.widget->width_policy.min_size();
                widgets.erase(std::begin(widgets) + index);
                return collect_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            if (*d.width >= width_deductions.front()) {
                *d.width -= width_deductions.front();
            } else {
                *d.width = 0;
            }
            width_left += width_deductions.front();
            width_deductions.pop_front();
        }
    }

    // SECOND GROUP - duplicate of above dependent on Policies to work with.
    if (width_left == 0) {
        return;
    }
    // Find total stretch
    total_stretch = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Find total of inverse of percentages
    total_inverse = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            total_inverse += 1 / (d.widget->width_policy.stretch() /
                                  static_cast<double>(total_stretch));
        }
    }

    // Calculate new widths of widgets in new group, if any go over max_width
    // then assign max value and recurse without that widget in vector.
    width_deductions.clear();
    index = 0;
    to_collect = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            width_deductions.push_back(
                ((1 / (d.widget->width_policy.stretch() /
                       static_cast<double>(total_stretch))) /
                 static_cast<double>(total_inverse)) *
                (to_collect * -1));
            if ((*d.width - width_deductions.back()) <
                d.widget->width_policy.min_size()) {
                width_left += *d.width - d.widget->width_policy.min_size();
                *d.width = d.widget->width_policy.min_size();
                widgets.erase(std::begin(widgets) + index);
                return collect_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            if (*d.width >= width_deductions.front()) {
                *d.width -= width_deductions.front();
            } else {
                *d.width = 0;
            }
            width_left += width_deductions.front();
            width_deductions.pop_front();
        }
    }
    // Change this to distribute the space, it might not be too small
    if (width_left != 0) {
        return;
    }
}